

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fInternalFormatQueryTests.cpp
# Opt level: O2

void __thiscall deqp::gles3::Functional::anon_unknown_1::SamplesCase::test(SamplesCase *this)

{
  CallLogWrapper *this_00;
  ostringstream *poVar1;
  ostringstream *this_01;
  int iVar2;
  TestContext *pTVar3;
  bool bVar4;
  ulong uVar5;
  int iVar6;
  StateQueryMemoryWriteGuard<int> maxSamples;
  StateQueryMemoryWriteGuard<int> sampleCounts;
  vector<int,_std::allocator<int>_> samples;
  undefined1 local_1b0 [384];
  
  deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::StateQueryMemoryWriteGuard
            (&sampleCounts);
  this_00 = &(this->super_ApiCase).super_CallLogWrapper;
  glu::CallLogWrapper::glGetInternalformativ
            (this_00,0x8d41,this->m_internalFormat,0x9380,1,&sampleCounts.m_value);
  ApiCase::expectError(&this->super_ApiCase,0);
  bVar4 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::verifyValidity
                    (&sampleCounts,
                     (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx);
  if (bVar4) {
    local_1b0._0_8_ =
         ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,"// sample counts is ");
    std::ostream::operator<<(poVar1,sampleCounts.m_value);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    if ((long)sampleCounts.m_value != 0) {
      samples.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
           = (pointer)0x0;
      samples.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      samples.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      local_1b0._0_4_ = 0xffffffff;
      std::vector<int,_std::allocator<int>_>::resize
                (&samples,(long)sampleCounts.m_value,(value_type_conflict1 *)local_1b0);
      glu::CallLogWrapper::glGetInternalformativ
                (this_00,0x8d41,this->m_internalFormat,0x80a9,sampleCounts.m_value,
                 samples.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start);
      ApiCase::expectError(&this->super_ApiCase,0);
      poVar1 = (ostringstream *)(local_1b0 + 8);
      this_01 = (ostringstream *)(local_1b0 + 8);
      iVar6 = 0;
      for (uVar5 = 0;
          uVar5 < (ulong)((long)samples.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_finish -
                          (long)samples.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start >> 2); uVar5 = uVar5 + 1) {
        iVar2 = samples.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[uVar5];
        if (iVar2 < 1) {
          local_1b0._0_8_ =
               ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->m_log
          ;
          std::__cxx11::ostringstream::ostringstream(poVar1);
          std::operator<<((ostream *)poVar1,
                          "// ERROR: Expected sample count to be at least one; got ");
          std::ostream::operator<<(poVar1,iVar2);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream(poVar1);
          pTVar3 = (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
          if (pTVar3->m_testResult == QP_TEST_RESULT_PASS) {
            tcu::TestContext::setTestResult(pTVar3,QP_TEST_RESULT_FAIL,"got invalid value");
          }
        }
        if (iVar6 <= iVar2 && uVar5 != 0) {
          local_1b0._0_8_ =
               ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->m_log
          ;
          std::__cxx11::ostringstream::ostringstream(this_01);
          std::operator<<((ostream *)this_01,
                          "// ERROR: Expected sample count to be ordered in descending order;");
          std::operator<<((ostream *)this_01,"got ");
          std::ostream::operator<<(this_01,iVar6);
          std::operator<<((ostream *)this_01," at index ");
          std::ostream::_M_insert<unsigned_long>((ulong)this_01);
          std::operator<<((ostream *)this_01,", and ");
          std::ostream::operator<<(this_01,iVar2);
          std::operator<<((ostream *)this_01," at index ");
          std::ostream::_M_insert<unsigned_long>((ulong)this_01);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream(this_01);
          pTVar3 = (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
          if (pTVar3->m_testResult == QP_TEST_RESULT_PASS) {
            tcu::TestContext::setTestResult(pTVar3,QP_TEST_RESULT_FAIL,"got invalid order");
          }
        }
        iVar6 = iVar2;
      }
      if (this->m_isIntegerInternalFormat == false) {
        deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::StateQueryMemoryWriteGuard
                  (&maxSamples);
        glu::CallLogWrapper::glGetIntegerv(this_00,0x8d57,&maxSamples.m_value);
        ApiCase::expectError(&this->super_ApiCase,0);
        bVar4 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::verifyValidity
                          (&maxSamples,
                           (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.
                           m_testCtx);
        if ((bVar4) &&
           (iVar6 = *samples.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start, iVar6 < maxSamples.m_value)) {
          local_1b0._0_8_ =
               ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->m_log
          ;
          poVar1 = (ostringstream *)(local_1b0 + 8);
          std::__cxx11::ostringstream::ostringstream(poVar1);
          std::operator<<((ostream *)poVar1,"// ERROR: Expected maximum value in SAMPLES (");
          std::ostream::operator<<(poVar1,iVar6);
          std::operator<<((ostream *)poVar1,") to be at least the value of MAX_SAMPLES (");
          std::ostream::operator<<(poVar1,maxSamples.m_value);
          std::operator<<((ostream *)poVar1,")");
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream(poVar1);
          pTVar3 = (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
          if (pTVar3->m_testResult == QP_TEST_RESULT_PASS) {
            tcu::TestContext::setTestResult
                      (pTVar3,QP_TEST_RESULT_FAIL,"got invalid maximum sample count");
          }
        }
      }
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&samples.super__Vector_base<int,_std::allocator<int>_>);
    }
  }
  return;
}

Assistant:

void test (void)
	{
		using tcu::TestLog;

		StateQueryMemoryWriteGuard<GLint> sampleCounts;
		glGetInternalformativ(GL_RENDERBUFFER, m_internalFormat, GL_NUM_SAMPLE_COUNTS, 1, &sampleCounts);
		expectError(GL_NO_ERROR);

		if (!sampleCounts.verifyValidity(m_testCtx))
			return;

		m_testCtx.getLog() << TestLog::Message << "// sample counts is " << sampleCounts << TestLog::EndMessage;

		if (sampleCounts == 0)
			return;

		std::vector<GLint> samples;
		samples.resize(sampleCounts, -1);
		glGetInternalformativ(GL_RENDERBUFFER, m_internalFormat, GL_SAMPLES, sampleCounts, &samples[0]);
		expectError(GL_NO_ERROR);

		GLint prevSampleCount = 0;
		GLint sampleCount = 0;
		for (size_t ndx = 0; ndx < samples.size(); ++ndx, prevSampleCount = sampleCount)
		{
			sampleCount = samples[ndx];

			// sample count must be > 0
			if (sampleCount <= 0)
			{
				m_testCtx.getLog() << TestLog::Message << "// ERROR: Expected sample count to be at least one; got " << sampleCount << TestLog::EndMessage;
				if (m_testCtx.getTestResult() == QP_TEST_RESULT_PASS)
					m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "got invalid value");
			}

			// samples must be ordered descending
			if (ndx != 0 && !(sampleCount < prevSampleCount))
			{
				m_testCtx.getLog() << TestLog::Message
					<< "// ERROR: Expected sample count to be ordered in descending order;"
					<< "got " << prevSampleCount << " at index " << (ndx - 1) << ", and " << sampleCount << " at index " << ndx << TestLog::EndMessage;
				if (m_testCtx.getTestResult() == QP_TEST_RESULT_PASS)
					m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "got invalid order");
			}
		}

		if (!m_isIntegerInternalFormat)
		{
			// the maximum value in SAMPLES is guaranteed to be at least the value of MAX_SAMPLES
			StateQueryMemoryWriteGuard<GLint> maxSamples;
			glGetIntegerv(GL_MAX_SAMPLES, &maxSamples);
			expectError(GL_NO_ERROR);

			if (maxSamples.verifyValidity(m_testCtx))
			{
				const GLint maximumFormatSampleCount = samples[0];
				if (!(maximumFormatSampleCount >= maxSamples))
				{
					m_testCtx.getLog() << TestLog::Message << "// ERROR: Expected maximum value in SAMPLES (" << maximumFormatSampleCount << ") to be at least the value of MAX_SAMPLES (" << maxSamples << ")" << TestLog::EndMessage;
					if (m_testCtx.getTestResult() == QP_TEST_RESULT_PASS)
						m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "got invalid maximum sample count");
				}
		  }
		}
	}